

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void duckdb_brotli::BrotliBuildHistogramsWithContext
               (Command *cmds,size_t num_commands,BlockSplit *literal_split,
               BlockSplit *insert_and_copy_split,BlockSplit *dist_split,uint8_t *ringbuffer,
               size_t start_pos,size_t mask,uint8_t prev_byte,uint8_t prev_byte2,
               ContextType *context_modes,HistogramLiteral *literal_histograms,
               HistogramCommand *insert_and_copy_histograms,HistogramDistance *copy_dist_histograms)

{
  uint *puVar1;
  BlockSplit *in_RCX;
  long lVar2;
  BlockSplit *in_RDX;
  ulong in_RSI;
  long in_RDI;
  BlockSplit *in_R8;
  long in_R9;
  size_t context_1;
  ContextLut lut;
  size_t context;
  size_t j;
  Command *cmd;
  size_t i;
  BlockSplitIterator dist_it;
  BlockSplitIterator insert_and_copy_it;
  BlockSplitIterator literal_it;
  size_t pos;
  uint32_t c;
  uint32_t r;
  size_t local_110;
  ulong local_108;
  ulong local_f8;
  BlockSplitIterator local_f0;
  BlockSplitIterator local_d0;
  BlockSplitIterator local_b0;
  size_t local_90;
  long local_88;
  BlockSplit *local_80;
  BlockSplit *local_78;
  ulong local_68;
  long local_60;
  ulong local_58;
  BlockSplit *local_50;
  ulong local_48;
  long local_40;
  uint *local_38;
  uint *local_30;
  uint local_28;
  int local_24;
  uint *local_20;
  uint local_14;
  long local_10;
  long local_8;
  
  local_90 = context_1;
  local_88 = in_R9;
  local_80 = in_R8;
  local_78 = in_RCX;
  local_68 = in_RSI;
  local_60 = in_RDI;
  InitBlockSplitIterator(&local_b0,in_RDX);
  InitBlockSplitIterator(&local_d0,local_78);
  InitBlockSplitIterator(&local_f0,local_80);
  for (local_f8 = 0; local_f8 < local_68; local_f8 = local_f8 + 1) {
    puVar1 = (uint *)(local_60 + local_f8 * 0x10);
    BlockSplitIteratorNext(&local_d0);
    local_50 = dist_it.split_ + local_d0.type_ * 0x3b;
    local_58 = (ulong)(ushort)puVar1[3];
    *(int *)((long)&local_50->num_types + local_58 * 4) =
         *(int *)((long)&local_50->num_types + local_58 * 4) + 1;
    local_50[0x3a].types_alloc_size = local_50[0x3a].types_alloc_size + 1;
    for (local_108 = (ulong)*puVar1; local_108 != 0; local_108 = local_108 - 1) {
      BlockSplitIteratorNext(&local_b0);
      local_110 = local_b0.type_;
      if (cmd != (Command *)0x0) {
        lVar2 = (long)(int)((&cmd->insert_len_)[local_b0.type_] << 9);
        local_110 = local_b0.type_ * 0x40 +
                    (long)(int)(uint)(byte)((&_kBrotliContextLookupTable)
                                            [(ulong)(byte)context + lVar2] |
                                           (&UNK_00b0a740)[(ulong)(byte)j + lVar2]);
      }
      local_40 = i + local_110 * 0x410;
      local_48 = (ulong)*(byte *)(local_88 + (local_90 & (ulong)lut));
      *(int *)(local_40 + local_48 * 4) = *(int *)(local_40 + local_48 * 4) + 1;
      *(long *)(local_40 + 0x400) = *(long *)(local_40 + 0x400) + 1;
      j._0_1_ = (byte)context;
      context._0_1_ = *(byte *)(local_88 + (local_90 & (ulong)lut));
      local_90 = local_90 + 1;
    }
    local_90 = (puVar1[1] & 0x1ffffff) + local_90;
    local_38 = puVar1;
    local_30 = puVar1;
    if ((puVar1[1] & 0x1ffffff) != 0) {
      j._0_1_ = *(byte *)(local_88 + (local_90 - 2 & (ulong)lut));
      context._0_1_ = *(byte *)(local_88 + (local_90 - 1 & (ulong)lut));
      if (0x7f < (ushort)puVar1[3]) {
        BlockSplitIteratorNext(&local_f0);
        local_24 = (int)(uint)(ushort)puVar1[3] >> 6;
        local_28 = (ushort)puVar1[3] & 7;
        if (((((local_24 != 0) && (local_24 != 2)) && (local_24 != 4)) && (local_24 != 7)) ||
           (local_14 = local_28, 2 < local_28)) {
          local_14 = 3;
        }
        local_8 = dist_it.idx_ + (local_f0.type_ * 4 + (ulong)local_14) * 0x890;
        local_10 = (long)(int)(*(ushort *)((long)puVar1 + 0xe) & 0x3ff);
        *(int *)(local_8 + local_10 * 4) = *(int *)(local_8 + local_10 * 4) + 1;
        *(long *)(local_8 + 0x880) = *(long *)(local_8 + 0x880) + 1;
        local_20 = puVar1;
      }
    }
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliBuildHistogramsWithContext(
    const Command* cmds, const size_t num_commands,
    const BlockSplit* literal_split, const BlockSplit* insert_and_copy_split,
    const BlockSplit* dist_split, const uint8_t* ringbuffer, size_t start_pos,
    size_t mask, uint8_t prev_byte, uint8_t prev_byte2,
    const ContextType* context_modes, HistogramLiteral* literal_histograms,
    HistogramCommand* insert_and_copy_histograms,
    HistogramDistance* copy_dist_histograms) {
  size_t pos = start_pos;
  BlockSplitIterator literal_it;
  BlockSplitIterator insert_and_copy_it;
  BlockSplitIterator dist_it;
  size_t i;

  InitBlockSplitIterator(&literal_it, literal_split);
  InitBlockSplitIterator(&insert_and_copy_it, insert_and_copy_split);
  InitBlockSplitIterator(&dist_it, dist_split);
  for (i = 0; i < num_commands; ++i) {
    const Command* cmd = &cmds[i];
    size_t j;
    BlockSplitIteratorNext(&insert_and_copy_it);
    HistogramAddCommand(&insert_and_copy_histograms[insert_and_copy_it.type_],
        cmd->cmd_prefix_);
    /* TODO(eustas): unwrap iterator blocks. */
    for (j = cmd->insert_len_; j != 0; --j) {
      size_t context;
      BlockSplitIteratorNext(&literal_it);
      context = literal_it.type_;
      if (context_modes) {
        ContextLut lut = BROTLI_CONTEXT_LUT(context_modes[context]);
        context = (context << BROTLI_LITERAL_CONTEXT_BITS) +
            BROTLI_CONTEXT(prev_byte, prev_byte2, lut);
      }
      HistogramAddLiteral(&literal_histograms[context],
          ringbuffer[pos & mask]);
      prev_byte2 = prev_byte;
      prev_byte = ringbuffer[pos & mask];
      ++pos;
    }
    pos += CommandCopyLen(cmd);
    if (CommandCopyLen(cmd)) {
      prev_byte2 = ringbuffer[(pos - 2) & mask];
      prev_byte = ringbuffer[(pos - 1) & mask];
      if (cmd->cmd_prefix_ >= 128) {
        size_t context;
        BlockSplitIteratorNext(&dist_it);
        context = (dist_it.type_ << BROTLI_DISTANCE_CONTEXT_BITS) +
            CommandDistanceContext(cmd);
        HistogramAddDistance(&copy_dist_histograms[context],
            cmd->dist_prefix_ & 0x3FF);
      }
    }
  }
}